

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_subdiv_mesh.cpp
# Opt level: O2

void __thiscall embree::SubdivMesh::printStatistics(SubdivMesh *this)

{
  size_t sVar1;
  ostream *poVar2;
  uint *puVar3;
  ulong uVar4;
  size_t e;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  sVar1 = (this->faceVertices).super_RawBufferView.num;
  puVar3 = (uint *)(this->faceVertices).super_RawBufferView.ptr_ofs;
  uVar4 = 0;
  uVar6 = 0;
  uVar8 = 0;
  uVar7 = 0;
  lVar5 = 0;
  while (bVar9 = sVar1 != 0, sVar1 = sVar1 - 1, bVar9) {
    switch((((this->topology).items)->halfEdges).items[lVar5].patch_type) {
    case BILINEAR_PATCH:
      uVar4 = uVar4 + 1;
      break;
    case REGULAR_QUAD_PATCH:
      uVar6 = uVar6 + 1;
      break;
    case IRREGULAR_QUAD_PATCH:
      uVar8 = uVar8 + 1;
      break;
    case COMPLEX_PATCH:
      uVar7 = uVar7 + 1;
    }
    lVar5 = lVar5 + (ulong)*puVar3;
    puVar3 = (uint *)((long)puVar3 + (this->faceVertices).super_RawBufferView.stride);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"numFaces = ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = std::operator<<(poVar2,"numBilinearFaces = ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," (");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,((float)uVar4 * 100.0) /
                             (float)(this->faceVertices).super_RawBufferView.num);
  poVar2 = std::operator<<(poVar2,"%), ");
  poVar2 = std::operator<<(poVar2,"numRegularQuadFaces = ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," (");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,((float)uVar6 * 100.0) /
                             (float)(this->faceVertices).super_RawBufferView.num);
  poVar2 = std::operator<<(poVar2,"%), ");
  poVar2 = std::operator<<(poVar2,"numIrregularQuadFaces ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," (");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,((float)uVar8 * 100.0) /
                             (float)(this->faceVertices).super_RawBufferView.num);
  poVar2 = std::operator<<(poVar2,"%) ");
  poVar2 = std::operator<<(poVar2,"numComplexFaces ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," (");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,((float)uVar7 * 100.0) /
                             (float)(this->faceVertices).super_RawBufferView.num);
  poVar2 = std::operator<<(poVar2,"%) ");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void SubdivMesh::printStatistics()
  {
    size_t numBilinearFaces = 0;
    size_t numRegularQuadFaces = 0;
    size_t numIrregularQuadFaces = 0;
    size_t numComplexFaces = 0;
    
    for (size_t e=0, f=0; f<numFaces(); e+=faceVertices[f++]) 
    {
      switch (topology[0].halfEdges[e].patch_type) {
      case HalfEdge::BILINEAR_PATCH      : numBilinearFaces++;   break;
      case HalfEdge::REGULAR_QUAD_PATCH  : numRegularQuadFaces++;   break;
      case HalfEdge::IRREGULAR_QUAD_PATCH: numIrregularQuadFaces++; break;
      case HalfEdge::COMPLEX_PATCH       : numComplexFaces++;   break;
      }
    }
    
    std::cout << "numFaces = " << numFaces() << ", " 
              << "numBilinearFaces = " << numBilinearFaces << " (" << 100.0f * numBilinearFaces / numFaces() << "%), " 
              << "numRegularQuadFaces = " << numRegularQuadFaces << " (" << 100.0f * numRegularQuadFaces / numFaces() << "%), " 
              << "numIrregularQuadFaces " << numIrregularQuadFaces << " (" << 100.0f * numIrregularQuadFaces / numFaces() << "%) " 
              << "numComplexFaces " << numComplexFaces << " (" << 100.0f * numComplexFaces / numFaces() << "%) " 
              << std::endl;
  }